

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_factory.cpp
# Opt level: O2

MemBankList *
n_e_s::core::MemBankFactory::create_nes_mem_banks
          (MemBankList *__return_storage_ptr__,IPpu *ppu,IRom *rom,INesController *controller1,
          INesController *controller2)

{
  MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *this;
  pointer *__ptr;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Head_base<0UL,_n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_*,_false>
  local_48;
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_40;
  INesController *controller2_local;
  INesController *controller1_local;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  controller2_local = controller2;
  controller1_local = controller1;
  local_88._M_unused._M_object = operator_new(0x10);
  *(undefined ***)local_88._M_unused._0_8_ = &PTR__IMemBank_00278c80;
  *(IRom **)((long)local_88._M_unused._0_8_ + 8) = rom;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_88);
  if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_88._M_unused._M_object + 8))();
  }
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)0,(unsigned_short)8191,(unsigned_short)2048>>();
  local_88._M_unused._0_8_ = local_68._M_unused._0_8_;
  local_68._M_unused._M_object = (void *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_88);
  if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_88._M_unused._M_object + 8))();
  }
  local_88._M_unused._M_object = (void *)0x0;
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>_>_>
  ::~unique_ptr((unique_ptr<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)0,_(unsigned_short)8191,_(unsigned_short)2048>_>_>
                 *)&local_68);
  this = (MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)
         operator_new(0x48);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/membank_factory.cpp:49:12)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/membank_factory.cpp:49:12)>
             ::_M_manager;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(unsigned_short,_unsigned_char),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/membank_factory.cpp:53:12)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(unsigned_short,_unsigned_char),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/membank_factory.cpp:53:12)>
             ::_M_manager;
  local_88._M_unused._M_object = ppu;
  local_68._M_unused._M_object = ppu;
  MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>::MappedMemBank
            (this,(ByteReader *)&local_88,(ByteWriter *)&local_68);
  local_48._M_head_impl = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  local_40._M_head_impl = (IMemBank *)local_48._M_head_impl;
  local_48._M_head_impl =
       (MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_40);
  if ((MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)
      local_40._M_head_impl !=
      (MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)0x0) {
    (*(((MemBankBase<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)
       &(local_40._M_head_impl)->_vptr_IMemBank)->super_IMemBank)._vptr_IMemBank[1])();
  }
  local_40._M_head_impl = (IMemBank *)0x0;
  std::
  unique_ptr<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>_>
  ::~unique_ptr((unique_ptr<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>_>
                 *)&local_48);
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16384,(unsigned_short)16405,(unsigned_short)22>>
            ();
  local_88._M_unused._0_8_ = local_68._M_unused._0_8_;
  local_68._M_unused._M_object = (long *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_88);
  if ((IPpu *)local_88._M_unused._0_8_ != (IPpu *)0x0) {
    (*(*local_88._M_unused._M_object)[1])();
  }
  local_88._M_unused._M_object = (void *)0x0;
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>_>_>
  ::~unique_ptr((unique_ptr<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16384,_(unsigned_short)16405,_(unsigned_short)22>_>_>
                 *)&local_68);
  std::
  make_unique<n_e_s::core::MemBankControllerIO,n_e_s::core::INesController*&,n_e_s::core::INesController*&>
            ((INesController **)&local_68,&controller1_local);
  local_88._M_unused._0_8_ = local_68._M_unused._0_8_;
  local_68._M_unused._M_object = (long *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_88);
  if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_88._M_unused._M_object + 8))();
  }
  local_88._M_unused._M_object = (void *)0x0;
  if ((long *)local_68._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_68._M_unused._M_object + 8))();
  }
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16408,(unsigned_short)16415,(unsigned_short)8>>()
  ;
  local_88._M_unused._0_8_ = local_68._M_unused._0_8_;
  local_68._M_unused._M_object = (void *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_88);
  if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
    (**(code **)(*local_88._M_unused._M_object + 8))();
  }
  local_88._M_unused._M_object = (void *)0x0;
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>_>_>
  ::~unique_ptr((unique_ptr<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16408,_(unsigned_short)16415,_(unsigned_short)8>_>_>
                 *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

MemBankList MemBankFactory::create_nes_mem_banks(IPpu *ppu,
        IRom *rom,
        INesController *controller1,
        INesController *controller2) {
    MemBankList mem_banks;

    // Rom, make sure this is first so the mapper can decide if it wants to
    // handle the address or not.
    mem_banks.push_back(std::make_unique<CpuRomTranslator>(rom));

    // Ram, repeats every 0x800 byte
    mem_banks.push_back(std::make_unique<MemBank<0x0000, 0x1FFF, 0x800>>());

    // Ppu, repeats every 0x8 byte
    mem_banks.push_back(std::make_unique<MappedMemBank<0x2000, 0x3FFF, 0x8>>(
            create_ppu_reader(ppu), create_ppu_writer(ppu)));

    // Io
    mem_banks.push_back(std::make_unique<MemBank<0x4000, 0x4015, 0x16>>());
    mem_banks.push_back(
            std::make_unique<MemBankControllerIO>(controller1, controller2));

    // Io dev
    mem_banks.push_back(std::make_unique<MemBank<0x4018, 0x401F, 0x8>>());

    return mem_banks;
}